

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cc
# Opt level: O0

void __thiscall
gvr::TriangleReceiver::setPolygon(TriangleReceiver *this,int instance,PLYValue *value)

{
  Mesh *this_00;
  uint a;
  uint b;
  uint c;
  ostream *this_01;
  long *in_RDX;
  int in_ESI;
  long in_RDI;
  
  this_00 = *(Mesh **)(in_RDI + 8);
  a = (**(code **)(*in_RDX + 0x28))(in_RDX,0);
  b = (**(code **)(*in_RDX + 0x28))(in_RDX,1);
  c = (**(code **)(*in_RDX + 0x28))(in_RDX,2);
  Mesh::setTriangleIndex(this_00,in_ESI,a,b,c);
  this_01 = std::operator<<((ostream *)&std::cerr,
                            "Warning: Cannot triangulate polygons in PLY file. Please recompile with GLU support."
                           );
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void TriangleReceiver::setPolygon(int instance, const PLYValue &value)
{
  p.setTriangleIndex(instance, value.getUnsignedInt(0), value.getUnsignedInt(1),
    value.getUnsignedInt(2));

  std::cerr << "Warning: Cannot triangulate polygons in PLY file. Please recompile with GLU support." << std::endl;
}